

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O0

bool __thiscall
bssl::anon_unknown_18::AppendHashAsOctetString
          (anon_unknown_18 *this,EVP_MD *hash_type,CBB *cbb,Input value)

{
  int iVar1;
  uint8_t *data;
  size_t count;
  bool local_a9;
  uchar local_a8 [8];
  uint8_t hash_buffer [64];
  uint local_5c;
  undefined1 local_58 [4];
  uint hash_len;
  CBB octet_string;
  CBB *cbb_local;
  EVP_MD *hash_type_local;
  Input value_local;
  
  value_local.data_.data_ = value.data_.data_;
  octet_string.u._24_8_ = hash_type;
  hash_type_local = (EVP_MD *)cbb;
  iVar1 = CBB_add_asn1((CBB *)hash_type,(CBB *)local_58,4);
  local_a9 = false;
  if (iVar1 != 0) {
    data = bssl::der::Input::data((Input *)&hash_type_local);
    count = bssl::der::Input::size((Input *)&hash_type_local);
    iVar1 = EVP_Digest(data,count,local_a8,&local_5c,(EVP_MD *)this,(ENGINE *)0x0);
    local_a9 = false;
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes((CBB *)local_58,local_a8,(ulong)local_5c);
      local_a9 = false;
      if (iVar1 != 0) {
        iVar1 = CBB_flush((CBB *)octet_string.u._24_8_);
        local_a9 = iVar1 != 0;
      }
    }
  }
  return local_a9;
}

Assistant:

bool AppendHashAsOctetString(const EVP_MD *hash_type, CBB *cbb,
                             der::Input value) {
  CBB octet_string;
  unsigned hash_len;
  uint8_t hash_buffer[EVP_MAX_MD_SIZE];

  return CBB_add_asn1(cbb, &octet_string, CBS_ASN1_OCTETSTRING) &&
         EVP_Digest(value.data(), value.size(), hash_buffer, &hash_len,
                    hash_type, nullptr) &&
         CBB_add_bytes(&octet_string, hash_buffer, hash_len) && CBB_flush(cbb);
}